

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall Equality_parseMath_Test::TestBody(Equality_parseMath_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  VariablePtr sin;
  VariablePtr sin_initial_value;
  ModelPtr model;
  VariablePtr x;
  ComponentPtr component;
  ParserPtr parser;
  AssertionResult local_e8;
  long local_d8 [2];
  long *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_c0;
  long *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  char local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  string *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  string *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  string local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38 [2];
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_48 = (string *)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"deriv_approx_sin.xml","");
  fileContents((string *)&local_e8);
  libcellml::Parser::parseModel(local_68);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  if (local_48 != (string *)local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sin","");
  libcellml::Component::create((string *)&local_48);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"x","");
  libcellml::Variable::create((string *)&local_58);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  psVar1 = local_58;
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"dimensionless","");
  libcellml::Variable::setUnits(psVar1);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  libcellml::Variable::setInterfaceType((InterfaceType)local_58);
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sin_initial_value","");
  libcellml::Variable::create((string *)&local_78);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  psVar1 = local_78;
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"dimensionless","");
  libcellml::Variable::setUnits(psVar1);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  libcellml::Variable::setInterfaceType((InterfaceType)local_78);
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sin","");
  libcellml::Variable::create((string *)&local_88);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  psVar1 = local_88;
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"dimensionless","");
  libcellml::Variable::setUnits(psVar1);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  libcellml::Variable::setInterfaceType((InterfaceType)local_88);
  libcellml::Variable::setInitialValue((shared_ptr *)local_88);
  psVar1 = local_48;
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n      <apply><eq/>\n        <apply><diff/>\n          <bvar><ci>x</ci></bvar>\n          <ci>sin</ci>\n        </apply>\n        <apply><cos/>\n          <ci>x</ci>\n        </apply>\n      </apply>\n    </math>\n"
             ,"");
  libcellml::Component::setMath(psVar1);
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  libcellml::ComponentEntity::component((ulong)local_98);
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"x","");
  libcellml::Component::variable((string *)&local_b8);
  local_c8 = local_b8;
  pbStack_c0 = pbStack_b0;
  local_b8 = (long *)0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8[0] = libcellml::Entity::equals((shared_ptr *)local_58);
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_c0);
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_b0);
  }
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_a8[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,local_a8,"x->equals(model->component(0)->variable(\"x\"))","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d0,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_e8._0_8_ != local_d8) {
      operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::component((ulong)local_98);
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sin_initial_value","");
  libcellml::Component::variable((string *)&local_b8);
  local_c8 = local_b8;
  pbStack_c0 = pbStack_b0;
  local_b8 = (long *)0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8[0] = libcellml::Entity::equals((shared_ptr *)local_78);
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_c0);
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_b0);
  }
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_a8[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,local_a8,
               "sin_initial_value->equals(model->component(0)->variable(\"sin_initial_value\"))",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d1,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_e8._0_8_ != local_d8) {
      operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::component((ulong)local_98);
  local_e8._0_8_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sin","");
  libcellml::Component::variable((string *)&local_b8);
  local_c8 = local_b8;
  pbStack_c0 = pbStack_b0;
  local_b8 = (long *)0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8[0] = libcellml::Entity::equals((shared_ptr *)local_88);
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_c0);
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_b0);
  }
  if ((long *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_a8[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,local_a8,"sin->equals(model->component(0)->variable(\"sin\"))","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d2,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_e8._0_8_ != local_d8) {
      operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_48;
  libcellml::ComponentEntity::component((ulong)&local_c8);
  local_e8._0_8_ = local_c8;
  local_e8.message_.ptr_ = pbStack_c0;
  local_c8 = (long *)0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8[0] = libcellml::Entity::equals((shared_ptr *)psVar1);
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_e8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.message_.ptr_);
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_c0);
  }
  if (local_a8[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,local_a8,"component->equals(model->component(0))","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d4,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_e8._0_8_ != local_d8) {
      operator_delete((void *)local_e8._0_8_,local_d8[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Equality, parseMath)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("deriv_approx_sin.xml"));

    libcellml::ComponentPtr component = libcellml::Component::create("sin");

    libcellml::VariablePtr x = libcellml::Variable::create("x");
    x->setUnits("dimensionless");
    x->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin_initial_value = libcellml::Variable::create("sin_initial_value");
    sin_initial_value->setUnits("dimensionless");
    sin_initial_value->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin = libcellml::Variable::create("sin");
    sin->setUnits("dimensionless");
    sin->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    sin->setInitialValue(sin_initial_value);

    component->setMath(
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "      <apply><eq/>\n"
        "        <apply><diff/>\n"
        "          <bvar><ci>x</ci></bvar>\n"
        "          <ci>sin</ci>\n"
        "        </apply>\n"
        "        <apply><cos/>\n"
        "          <ci>x</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </math>\n");

    EXPECT_TRUE(x->equals(model->component(0)->variable("x")));
    EXPECT_TRUE(sin_initial_value->equals(model->component(0)->variable("sin_initial_value")));
    EXPECT_TRUE(sin->equals(model->component(0)->variable("sin")));

    EXPECT_TRUE(component->equals(model->component(0)));
}